

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O2

int http_should_keep_alive(http_parser *parser)

{
  uint uVar1;
  
  if ((parser->http_major == 0) || (parser->http_minor == 0)) {
    if ((undefined1  [32])((undefined1  [32])*parser & (undefined1  [32])0x8) !=
        (undefined1  [32])0x0) goto LAB_0015cea9;
  }
  else if ((undefined1  [32])((undefined1  [32])*parser & (undefined1  [32])0x10) ==
           (undefined1  [32])0x0) {
LAB_0015cea9:
    uVar1 = http_message_needs_eof(parser);
    return uVar1 ^ 1;
  }
  return 0;
}

Assistant:

int
http_should_keep_alive (const http_parser *parser)
{
  if (parser->http_major > 0 && parser->http_minor > 0) {
    /* HTTP/1.1 */
    if (parser->flags & F_CONNECTION_CLOSE) {
      return 0;
    }
  } else {
    /* HTTP/1.0 or earlier */
    if (!(parser->flags & F_CONNECTION_KEEP_ALIVE)) {
      return 0;
    }
  }

  return !http_message_needs_eof(parser);
}